

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall tetgenmesh::checkseg4encroach(tetgenmesh *this,point pa,point pb,point checkpt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar12;
  double dVar13;
  double prjpt [3];
  double local_28;
  double local_20;
  double local_18;
  
  dVar1 = *pa;
  dVar2 = pa[1];
  dVar3 = *checkpt;
  dVar4 = checkpt[1];
  dVar5 = pa[2];
  dVar6 = checkpt[2];
  dVar11 = *pb;
  dVar12 = pb[1];
  dVar13 = pb[2];
  if ((dVar13 - dVar6) * (dVar5 - dVar6) +
      (dVar12 - dVar4) * (dVar2 - dVar4) + (dVar11 - dVar3) * (dVar1 - dVar3) < 0.0) {
    if (this->b->metric == 0) {
      return 1;
    }
    dVar7 = pa[this->pointmtrindex];
    if (dVar7 <= 0.0) {
      return 1;
    }
    dVar8 = pb[this->pointmtrindex];
    if (dVar8 <= 0.0) {
      return 1;
    }
    projpt2edge(this,checkpt,pa,pb,&local_28);
    dVar11 = dVar11 - dVar1;
    dVar12 = dVar12 - dVar2;
    auVar9._0_8_ = (local_28 - dVar1) * (local_28 - dVar1) + (local_20 - dVar2) * (local_20 - dVar2)
    ;
    auVar9._8_8_ = dVar11 * dVar11 + dVar12 * dVar12;
    dVar13 = dVar13 - dVar5;
    auVar10._8_8_ = dVar13 * dVar13 + auVar9._8_8_;
    auVar10._0_8_ = (local_18 - dVar5) * (local_18 - dVar5) + auVar9._0_8_;
    auVar10 = sqrtpd(auVar9,auVar10);
    if (SQRT((local_18 - dVar6) * (local_18 - dVar6) +
             (local_28 - dVar3) * (local_28 - dVar3) + (local_20 - dVar4) * (local_20 - dVar4)) <
        (dVar8 - dVar7) * (auVar10._0_8_ / auVar10._8_8_) + dVar7) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int tetgenmesh::checkseg4encroach(point pa, point pb, point checkpt)
{
  // Check if the point lies inside the diametrical sphere of this seg. 
  REAL v1[3], v2[3];

  v1[0] = pa[0] - checkpt[0];
  v1[1] = pa[1] - checkpt[1];
  v1[2] = pa[2] - checkpt[2];
  v2[0] = pb[0] - checkpt[0];
  v2[1] = pb[1] - checkpt[1];
  v2[2] = pb[2] - checkpt[2];

  if (dot(v1, v2) < 0) {
    // Inside.
    if (b->metric) { // -m option.
      if ((pa[pointmtrindex] > 0) && (pb[pointmtrindex] > 0)) {
        // The projection of 'checkpt' lies inside the segment [a,b].
        REAL prjpt[3], u, v, t;
        projpt2edge(checkpt, pa, pb, prjpt);
        // Interoplate the mesh size at the location 'prjpt'.
        u = distance(pa, pb);
        v = distance(pa, prjpt);
        t = v / u;
        // 'u' is the mesh size at 'prjpt'
        u = pa[pointmtrindex] + t * (pb[pointmtrindex] - pa[pointmtrindex]);
        v = distance(checkpt, prjpt);
        if (v < u) {
          return 1; // Encroached prot-ball!
        }
      } else {
        return 1; // NO protecting ball. Encroached.
      }
    } else {
      return 1; // Inside! Encroached.
    }
  }

  return 0;
}